

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericRegex
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  if (this->ownAllocator_ != (CrtAllocator *)0x0) {
    operator_delete(this->ownAllocator_,1);
  }
  Stack<rapidjson::CrtAllocator>::~Stack(&this->ranges_);
  Stack<rapidjson::CrtAllocator>::~Stack(&this->states_);
  return;
}

Assistant:

~GenericRegex()
    {
        RAPIDJSON_DELETE(ownAllocator_);
    }